

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O3

string * __thiscall
banksia::ChessBoard::toString_abi_cxx11_(string *__return_storage_ptr__,ChessBoard *this)

{
  string *psVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  ostringstream stringStream;
  char *local_1d0;
  long local_1c8;
  char local_1c0 [16];
  string *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  (*(this->super_BoardCore).super_Obj._vptr_Obj[0xb])(&local_1d0,this,0,1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_1d0,local_1c8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_1b0 = __return_storage_ptr__;
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  uVar4 = 0;
  do {
    if ((ulong)((long)(this->super_BoardCore).pieces.
                      super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->super_BoardCore).pieces.
                      super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= uVar4) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4);
    }
    local_1d0 = local_1c0;
    std::__cxx11::string::_M_construct((ulong)&local_1d0,'\x01');
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_1d0,local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0);
    }
    if ((uVar4 != 0) &&
       (iVar2 = (*(this->super_BoardCore).super_Obj._vptr_Obj[8])(this,uVar4 & 0xffffffff),
       iVar2 == 7)) {
      iVar2 = (*(this->super_BoardCore).super_Obj._vptr_Obj[9])(this,uVar4 & 0xffffffff);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,8 - iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x40);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"a b c d e f g h \n",0x11)
  ;
  psVar1 = local_1b0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"key: ",5);
  (*(this->super_BoardCore).super_Obj._vptr_Obj[0xc])(this);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

std::string ChessBoard::toString() const {
    
    std::ostringstream stringStream;
    
    stringStream << getFen() << std::endl;
    
    for (int i = 0; i<64; i++) {
        auto piece = getPiece(i);
        
        stringStream << Piece::toString(piece.type, piece.side) << " ";
        
        if (i > 0 && getColumn(i) == 7) {
            int row = 8 - getRow(i);
            stringStream << " " << row << "\n";
        }
    }
    
    stringStream << "a b c d e f g h \n";
    stringStream << "key: " << key() << std::endl;
    
    return stringStream.str();
}